

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzAddW2(word *a,size_t n,word w)

{
  size_t i;
  word w_local;
  size_t n_local;
  word *a_local;
  
  w_local = w;
  for (i = 0; i < n; i = i + 1) {
    a[i] = w_local + a[i];
    w_local = (word)(int)(uint)(a[i] < w_local);
  }
  return w_local;
}

Assistant:

word zzAddW2(word a[], size_t n, register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
#ifndef SAFE_FAST
	for (i = 0; i < n; ++i)
		a[i] += w, w = wordLess(a[i], w);
#else
	for (i = 0; w && i < n; ++i)
		a[i] += w, w = a[i] < w;
#endif
	return w;
}